

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O0

_Bool al_set_mixer_frequency(ALLEGRO_MIXER *mixer,uint val)

{
  undefined4 in_ESI;
  long in_RDI;
  bool bVar1;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = *(long *)(in_RDI + 0xf8) == 0;
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x88) = in_ESI;
  }
  else {
    _al_set_error((int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  return bVar1;
}

Assistant:

bool al_set_mixer_frequency(ALLEGRO_MIXER *mixer, unsigned int val)
{
   ASSERT(mixer);

   /* You can change the frequency of a mixer as long as it's not attached
    * to anything.
    */
   if (mixer->ss.parent.u.ptr) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
            "Attempted to change the frequency of an attached mixer");
      return false;
   }

   mixer->ss.spl_data.frequency = val;
   return true;
}